

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,decimal_fp<double> *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  significand_type *significand_00;
  size_type sVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  byte *__s;
  size_t sVar5;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar6;
  uint uVar7;
  byte bVar8;
  undefined7 in_register_00000081;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  sign_t sVar13;
  ulong uVar14;
  char *out_00;
  int significand_size_00;
  byte *pbVar15;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_7_ef14d3db write;
  undefined1 local_a1 [5];
  sign_t local_9c;
  int local_98;
  uint local_94;
  int local_90;
  uint local_8c;
  significand_type *local_88;
  undefined1 local_7c [12];
  undefined1 local_70 [8];
  anon_class_56_7_a2a26a24 local_68;
  ulong uVar12;
  
  significand_00 = (significand_type *)fp->significand;
  significand_size_00 =
       (uint)*(ushort *)
              (bsr2log10(int)::data + (ulong)((uint)LZCOUNT((ulong)significand_00 | 1) ^ 0x3f) * 2)
       - (uint)(significand_00 <
               *(significand_type **)
                (basic_data<void>::zero_or_powers_of_10_64_new +
                (ulong)*(ushort *)
                        (bsr2log10(int)::data +
                        (ulong)((uint)LZCOUNT((ulong)significand_00 | 1) ^ 0x3f) * 2) * 8));
  uVar14 = (ulong)fspecs >> 0x28 & 0xff;
  sVar13 = (sign_t)uVar14;
  local_a1[0] = decimal_point;
  local_9c = sVar13;
  local_98 = significand_size_00;
  local_88 = significand_00;
  local_70 = (undefined1  [8])fspecs;
  if (-1 < significand_size_00) {
    iVar3 = fp->exponent;
    uVar11 = (significand_size_00 + 1) - (uint)(sVar13 == none);
    uVar12 = (ulong)uVar11;
    local_7c._0_4_ = iVar3 + significand_size_00;
    uVar7 = fspecs.precision;
    uVar9 = fspecs._4_4_;
    if (fspecs._4_1_ == '\x01') {
LAB_0014567d:
      local_90 = iVar3 + -1 + significand_size_00;
      if ((uVar9 >> 0x14 & 1) == 0) {
        local_94 = 0;
        local_8c = (uint)(byte)decimal_point;
        if (significand_size_00 == 1) {
          local_8c = 0;
        }
      }
      else {
        local_94 = ~((int)(uVar7 - significand_size_00) >> 0x1f) & uVar7 - significand_size_00;
        uVar12 = (ulong)(uVar11 + local_94);
        local_8c = (uint)CONCAT71(in_register_00000081,decimal_point);
      }
      local_68.sign = (sign_t *)CONCAT44(local_68.sign._4_4_,sVar13);
      local_68.significand_size._0_5_ = CONCAT14((char)local_8c,significand_size_00);
      iVar3 = 1 - local_7c._0_4_;
      if (0 < (int)local_7c._0_4_) {
        iVar3 = local_90;
      }
      lVar4 = 2;
      if (99 < iVar3) {
        lVar4 = (ulong)(999 < iVar3) + 3;
      }
      sVar5 = (3 - (ulong)((char)local_8c == '\0')) + uVar12 + lVar4;
      bVar8 = ((uVar9 >> 0x10 & 1) == 0) << 5;
      local_68.fp = (decimal_fp<double> *)
                    (CONCAT35(local_68.fp._5_3_,CONCAT14(bVar8,local_94)) | 0x4500000000);
      local_68.fspecs = (float_specs *)CONCAT44(local_68.fspecs._4_4_,local_90);
      local_68.significand = significand_00;
      if (0 < specs->width) {
        bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                          (out,specs,sVar5,sVar5,(anon_class_40_7_ef14d3db *)&local_68);
        return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )bVar6.container;
      }
      sVar1 = (out.container)->_M_string_length;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (out.container,sVar5 + sVar1,'\0');
      uVar7 = local_94;
      out_00 = ((out.container)->_M_dataplus)._M_p + sVar1;
      if (sVar13 != none) {
        *out_00 = *(char *)((long)&basic_data<void>::signs + uVar14);
        out_00 = out_00 + 1;
      }
      local_7c._4_8_ = out.container;
      __s = (byte *)write_significand<char,_unsigned_long,_0>
                              (out_00,(unsigned_long)significand_00,significand_size_00,1,
                               (char)local_8c);
      pbVar15 = __s;
      if (uVar7 != 0) {
        pbVar15 = __s + uVar7;
        memset(__s,0x30,(ulong)uVar7);
      }
      uVar2 = local_7c._4_8_;
      *pbVar15 = bVar8 | 0x45;
      write_exponent<char,char*>(local_90,(char *)(pbVar15 + 1));
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar2;
    }
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar10 = 0x10;
      if (0 < (int)uVar7) {
        uVar10 = uVar7;
      }
      if (((int)local_7c._0_4_ < -3) || ((int)uVar10 < (int)local_7c._0_4_)) goto LAB_0014567d;
    }
    if (-1 < iVar3) {
      local_a1._1_4_ = uVar7 - local_7c._0_4_;
      sVar5 = (size_t)(iVar3 + uVar11);
      if ((uVar9 >> 0x14 & 1) != 0) {
        if ((fspecs._4_1_ == '\x02') || (0 < (int)local_a1._1_4_)) {
          if ((int)local_a1._1_4_ < 1) goto LAB_00145839;
        }
        else {
          local_a1._1_4_ = 1;
        }
        sVar5 = sVar5 + (uint)local_a1._1_4_;
      }
LAB_00145839:
      local_68.sign = &local_9c;
      local_68.significand = (significand_type *)&local_88;
      local_68.significand_size = &local_98;
      local_68.fspecs = (float_specs *)local_70;
      local_68.decimal_point = local_a1;
      local_68.num_zeros = (int *)(local_a1 + 1);
      local_68.fp = fp;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_&>
                        (out,specs,sVar5,sVar5,&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
    if (0 < (int)local_7c._0_4_) {
      local_68.decimal_point = local_a1 + 1;
      local_68.sign = &local_9c;
      local_68.significand = (significand_type *)&local_88;
      local_68.significand_size = &local_98;
      local_68.fp = (decimal_fp<double> *)local_7c;
      local_a1._1_4_ = uVar7 - significand_size_00 & (int)(uVar9 << 0xb) >> 0x1f;
      local_68.fspecs = (float_specs *)local_a1;
      sVar5 = (ulong)(uint)(~((int)local_a1._1_4_ >> 0x1f) & local_a1._1_4_) + 1 + uVar12;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_&>
                        (out,specs,sVar5,sVar5,(anon_class_48_6_48d028d1 *)&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
    uVar9 = -local_7c._0_4_;
    local_a1._1_4_ = uVar9;
    if (SBORROW4(uVar7,uVar9) != (int)(uVar7 + local_7c._0_4_) < 0) {
      local_a1._1_4_ = uVar7;
    }
    if ((int)uVar7 < 0) {
      local_a1._1_4_ = uVar9;
    }
    if (significand_size_00 != 0) {
      local_a1._1_4_ = uVar9;
    }
    if (-1 < (int)local_a1._1_4_) {
      sVar5 = (ulong)(uint)local_a1._1_4_ + 2 + uVar12;
      local_68.sign = &local_9c;
      local_68.significand = (significand_type *)(local_a1 + 1);
      local_68.significand_size = &local_98;
      local_68.fp = (decimal_fp<double> *)local_70;
      local_68.fspecs = (float_specs *)local_a1;
      local_68.decimal_point = (char *)&local_88;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_&>
                        (out,specs,sVar5,sVar5,(anon_class_48_6_9afe1116 *)&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}